

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parseWhileExpr(Parser *this)

{
  long lVar1;
  CompileContext *pCVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  string *in_RSI;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> condition;
  unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> body;
  Token keyword;
  undefined1 local_90 [16];
  char *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  TokenType local_50;
  _Alloc_hider local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  line_t local_28;
  col_t local_24;
  
  local_50 = *(TokenType *)&in_RSI[5].field_2;
  lVar1 = *(long *)((long)&in_RSI[5].field_2 + 8);
  local_48._M_p = (pointer)&local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,lVar1,in_RSI[6]._M_dataplus._M_p + lVar1);
  local_24 = *(col_t *)((long)&in_RSI[6].field_2 + 0xc);
  local_28 = *(line_t *)((long)&in_RSI[6].field_2 + 8);
  parseExpr((Parser *)local_90);
  local_80 = local_78._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,"Expected \'{\' or \'=>\' before while loop body.","");
  expectBlock((Parser *)(local_90 + 8),in_RSI);
  if (local_80 != local_78._M_local_buf + 8) {
    operator_delete(local_80,local_78._8_8_ + 1);
  }
  pCVar2 = (CompileContext *)operator_new(0x48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_p == &local_38) {
    local_68._8_4_ = local_38._8_4_;
    local_68._12_4_ = local_38._12_4_;
    local_78._M_allocated_capacity = (size_type)&local_68;
  }
  else {
    local_78._M_allocated_capacity = (size_type)local_48._M_p;
  }
  local_68._M_allocated_capacity._4_4_ = local_38._M_allocated_capacity._4_4_;
  local_68._M_allocated_capacity._0_4_ = local_38._M_allocated_capacity._0_4_;
  (pCVar2->m_source)._M_dataplus._M_p = (pointer)&PTR__WhileExpr_00129350;
  (pCVar2->m_source)._M_string_length = local_90._0_8_;
  (pCVar2->m_source).field_2._M_allocated_capacity = local_90._8_8_;
  *(TokenType *)((long)&(pCVar2->m_source).field_2 + 8) = local_50;
  paVar3 = &(pCVar2->m_options).m_filename.field_2;
  (pCVar2->m_options).m_filename._M_dataplus._M_p = (pointer)paVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_allocated_capacity == &local_68) {
    *(undefined4 *)paVar3 = local_38._M_allocated_capacity._0_4_;
    *(undefined4 *)((long)&(pCVar2->m_options).m_filename.field_2 + 4) =
         local_38._M_allocated_capacity._4_4_;
    *(undefined4 *)((long)&(pCVar2->m_options).m_filename.field_2 + 8) = local_68._8_4_;
    *(undefined4 *)((long)&(pCVar2->m_options).m_filename.field_2 + 0xc) = local_68._12_4_;
  }
  else {
    (pCVar2->m_options).m_filename._M_dataplus._M_p = (pointer)local_78._M_allocated_capacity;
    (pCVar2->m_options).m_filename.field_2._M_allocated_capacity = local_68._0_8_;
  }
  (pCVar2->m_options).m_filename._M_string_length = local_40;
  *(col_t *)((long)&(pCVar2->m_options).m_programArgs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 4) = local_24;
  *(line_t *)
   &(pCVar2->m_options).m_programArgs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = local_28;
  this->m_context = pCVar2;
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseWhileExpr() {
        Token keyword = m_previous;

        std::unique_ptr<Expr> condition = parseExpr();
        std::unique_ptr<BlockExpr> body = expectBlock("Expected '{' or '=>' before while loop body.");

        return std::make_unique<WhileExpr>(std::move(condition), std::move(body), std::move(keyword));
    }